

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O1

word Mpm_CutTruthFromDsd(Mpm_Man_t *pMan,Mpm_Cut_t *pCut,int iClass)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  word *pwVar4;
  ulong uVar5;
  
  uVar3 = *(uint *)&pCut->field_0x4 >> 0x1b;
  if (pMan->pDsd6[iClass].nVars != uVar3) {
    __assert_fail("pMan->pDsd6[iClass].nVars == (int)pCut->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mpm/mpmDsd.c"
                  ,0x377,"word Mpm_CutTruthFromDsd(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  uVar5 = pMan->pDsd6[iClass].uTruth;
  if (0x7ffffff < *(uint *)&pCut->field_0x4) {
    pwVar4 = s_Truths6;
    uVar2 = 0;
    do {
      if (pCut->pLeaves[uVar2] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((pCut->pLeaves[uVar2] & 1U) != 0) {
        bVar1 = (byte)(1 << ((byte)uVar2 & 0x1f));
        uVar5 = (*pwVar4 & uVar5) >> (bVar1 & 0x3f) | uVar5 << (bVar1 & 0x3f) & *pwVar4;
      }
      uVar2 = uVar2 + 1;
      pwVar4 = pwVar4 + 1;
    } while (uVar3 != uVar2);
  }
  return uVar5;
}

Assistant:

word Mpm_CutTruthFromDsd( Mpm_Man_t * pMan, Mpm_Cut_t * pCut, int iClass )
{
    int i;
    word uTruth = pMan->pDsd6[iClass].uTruth;
    assert( pMan->pDsd6[iClass].nVars == (int)pCut->nLeaves );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( Abc_LitIsCompl(pCut->pLeaves[i]) )
            uTruth = Abc_Tt6Flip( uTruth, i ); 
    return uTruth;
}